

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

QDataStream * __thiscall QDataStream::operator>>(QDataStream *this,qint32 *i)

{
  int iVar1;
  qint64 qVar2;
  int *in_RSI;
  QDataStream *in_RDI;
  QDataStream *in_stack_fffffffffffffff8;
  
  *in_RSI = 0;
  if (in_RDI->dev != (QIODevice *)0x0) {
    qVar2 = readBlock(in_stack_fffffffffffffff8,(char *)in_RDI,(qint64)in_RSI);
    if (qVar2 == 4) {
      if ((in_RDI->noswap & 1U) == 0) {
        iVar1 = qbswap<int,void>(0);
        *in_RSI = iVar1;
      }
    }
    else {
      *in_RSI = 0;
    }
  }
  return in_RDI;
}

Assistant:

QDataStream &QDataStream::operator>>(qint32 &i)
{
    i = 0;
    CHECK_STREAM_PRECOND(*this)
    if (readBlock(reinterpret_cast<char *>(&i), 4) != 4) {
        i = 0;
    } else {
        if (!noswap) {
            i = qbswap(i);
        }
    }
    return *this;
}